

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.hpp
# Opt level: O0

long cfgfile::format_t<long,_cfgfile::qstring_trait_t>::from_string
               (parser_info_t<cfgfile::qstring_trait_t> *info,string_t *value)

{
  long lVar1;
  exception_t<cfgfile::qstring_trait_t> *this;
  parser_info_t<cfgfile::qstring_trait_t> *in_RDI;
  long result;
  bool ok;
  qstring_wrapper_t *in_stack_fffffffffffffdd8;
  undefined8 in_stack_fffffffffffffde0;
  int base;
  bool *in_stack_fffffffffffffde8;
  string_t *what;
  QString *in_stack_fffffffffffffdf0;
  undefined6 in_stack_fffffffffffffe10;
  undefined1 uVar2;
  undefined1 in_stack_fffffffffffffe17;
  string *in_stack_fffffffffffffe18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  string_t local_151 [12];
  long local_20;
  byte local_11;
  parser_info_t<cfgfile::qstring_trait_t> *local_8;
  
  base = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  local_11 = 0;
  local_8 = in_RDI;
  qstring_wrapper_t::operator_cast_to_QString(in_stack_fffffffffffffdd8);
  lVar1 = QString::toLong(in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,base);
  QString::~QString((QString *)0x13efc4);
  if ((local_11 & 1) == 0) {
    uVar2 = 1;
    local_20 = lVar1;
    this = (exception_t<cfgfile::qstring_trait_t> *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    qstring_trait_t::from_ascii(in_stack_fffffffffffffe18);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffe18,
              (qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    what = local_151;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    qstring_trait_t::from_ascii(in_stack_fffffffffffffe18);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffe18,
              (qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    parser_info_t<cfgfile::qstring_trait_t>::file_name(local_8);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffe18,
              (qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    qstring_trait_t::from_ascii(in_stack_fffffffffffffe18);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffe18,
              (qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    parser_info_t<cfgfile::qstring_trait_t>::line_number(local_8);
    qstring_trait_t::to_string((pos_t)in_stack_fffffffffffffe18);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffe18,
              (qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe20,(char *)in_stack_fffffffffffffe18,
               (allocator<char> *)
               CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    qstring_trait_t::from_ascii(in_stack_fffffffffffffe18);
    operator+((qstring_wrapper_t *)in_stack_fffffffffffffe18,
              (qstring_wrapper_t *)
              CONCAT17(in_stack_fffffffffffffe17,CONCAT16(uVar2,in_stack_fffffffffffffe10)));
    exception_t<cfgfile::qstring_trait_t>::exception_t(this,what);
    __cxa_throw(this,&exception_t<cfgfile::qstring_trait_t>::typeinfo,
                exception_t<cfgfile::qstring_trait_t>::~exception_t);
  }
  return lVar1;
}

Assistant:

static long from_string( const parser_info_t< qstring_trait_t > & info,
		const qstring_trait_t::string_t & value )
	{
		bool ok = false;
		long result = ((QString)value).toLong( &ok );

		if( !ok )
			throw exception_t< qstring_trait_t >(
				qstring_trait_t::from_ascii( "Invalid value: \"" ) +
				value + qstring_trait_t::from_ascii( "\". In file \"" ) +
				info.file_name() +
				qstring_trait_t::from_ascii( "\" on line " ) +
				qstring_trait_t::to_string( info.line_number() ) +
				qstring_trait_t::from_ascii( "." ) );
		else
			return result;
	}